

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::make_memory_string_abi_cxx11_(lest *this,void *item,size_t size)

{
  bool bVar1;
  ostream *poVar2;
  string local_1e8 [32];
  int local_1c8;
  int local_1c4;
  char local_1be;
  char local_1bd;
  ostringstream local_1b0 [8];
  ostringstream os;
  uchar *bytes;
  int inc;
  int end;
  int i;
  anon_class_1_0_00000001 is_little_endian;
  size_t size_local;
  void *item_local;
  
  inc = 0;
  bytes._4_4_ = (int)size;
  bytes._0_4_ = 1;
  _i = size;
  bVar1 = make_memory_string::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)((long)&end + 3));
  if (bVar1) {
    inc = bytes._4_4_ + -1;
    bytes._0_4_ = -1;
    bytes._4_4_ = -1;
  }
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar2 = std::operator<<((ostream *)local_1b0,"0x");
  local_1be = (char)std::setfill<char>('0');
  local_1bd = local_1be;
  poVar2 = std::operator<<(poVar2,local_1be);
  std::ostream::operator<<(poVar2,std::hex);
  for (; inc != bytes._4_4_; inc = (int)bytes + inc) {
    local_1c8 = (int)std::setw(2);
    local_1c4 = local_1c8;
    poVar2 = std::operator<<((ostream *)local_1b0,(_Setw)local_1c8);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*(byte *)((long)item + (long)inc));
    std::operator<<(poVar2," ");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return this;
}

Assistant:

inline
auto make_memory_string( void const * item, std::size_t size ) -> std::string
{
    // reverse order for little endian architectures:

    auto is_little_endian = []
    {
        union U { int i = 1; char c[ sizeof(int) ]; };

        return 1 != U{}.c[ sizeof(int) - 1 ];
    };

    int i = 0, end = static_cast<int>( size ), inc = 1;

    if ( is_little_endian() ) { i = end - 1; end = inc = -1; }

    unsigned char const * bytes = static_cast<unsigned char const *>( item );

    std::ostringstream os;
    os << "0x" << std::setfill( '0' ) << std::hex;
    for ( ; i != end; i += inc )
    {
        os << std::setw(2) << static_cast<unsigned>( bytes[i] ) << " ";
    }
    return os.str();
}